

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O0

ssize_t __thiscall DomResource::write(DomResource *this,int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  undefined4 in_register_00000034;
  DomResource *this_00;
  long in_FS_OFFSET;
  char16_t *str;
  DataPointer *in_stack_ffffffffffffff18;
  DomResource *str_00;
  undefined7 in_stack_ffffffffffffff30;
  byte bVar2;
  QAnyStringView *local_58;
  QArrayDataPointer<char16_t> local_48 [2];
  long local_8;
  
  this_00 = (DomResource *)CONCAT44(in_register_00000034,__fd);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  str_00 = this_00;
  bVar1 = QString::isEmpty((QString *)0x1a4a19);
  bVar2 = 0;
  if (bVar1) {
    QArrayDataPointer<char16_t>::QArrayDataPointer(local_48,(Data *)0x0,L"resource",8);
    bVar2 = 1;
    QString::QString(&this->m_attr_location,in_stack_ffffffffffffff18);
  }
  else {
    QString::toLower((QString *)in_stack_ffffffffffffff18);
  }
  QAnyStringView::QAnyStringView
            ((QAnyStringView *)CONCAT17(bVar2,in_stack_ffffffffffffff30),&str_00->m_attr_location);
  QXmlStreamWriter::writeStartElement((QAnyStringView *)str_00);
  QString::~QString((QString *)0x1a4acc);
  if ((bVar2 & 1) != 0) {
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)this);
  }
  bVar1 = hasAttributeLocation(this);
  if (bVar1) {
    Qt::Literals::StringLiterals::operator____s
              ((char16_t *)__buf,CONCAT17(bVar2,in_stack_ffffffffffffff30));
    QAnyStringView::QAnyStringView
              ((QAnyStringView *)CONCAT17(bVar2,in_stack_ffffffffffffff30),&str_00->m_attr_location)
    ;
    attributeLocation(this_00);
    QAnyStringView::QAnyStringView
              ((QAnyStringView *)CONCAT17(bVar2,in_stack_ffffffffffffff30),&str_00->m_attr_location)
    ;
    QXmlStreamWriter::writeAttribute((QAnyStringView *)this_00,local_58);
    QString::~QString((QString *)0x1a4b71);
    QString::~QString((QString *)0x1a4b7b);
  }
  QXmlStreamWriter::writeEndElement();
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return *(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void DomResource::write(QXmlStreamWriter &writer, const QString &tagName) const
{
    writer.writeStartElement(tagName.isEmpty() ? QStringLiteral("resource") : tagName.toLower());

    if (hasAttributeLocation())
        writer.writeAttribute(u"location"_s, attributeLocation());

    writer.writeEndElement();
}